

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::mouseMoveEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  SubControl SVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar5;
  QWidget *this_01;
  QRect QVar6;
  bool bVar7;
  char cVar8;
  SubControl SVar9;
  int iVar10;
  Operation OVar11;
  QStyle *pQVar12;
  QPoint QVar13;
  long in_FS_OFFSET;
  QRect QVar14;
  QPointF QVar15;
  undefined1 local_c0 [16];
  QRegion hoverRegion;
  QStyleOptionTitleBar options;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
      QWidget::mouseMoveEvent(&this->super_QWidget,mouseEvent);
      return;
    }
    goto LAB_0041c67f;
  }
  if (this_00->currentOperation == None) {
    options.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    options._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    options.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.styleObject =
         (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.palette.d =
         (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMdiSubWindowPrivate::titleBarOptions(&options,this_00);
    SVar1 = this_00->hoveredSubControl;
    QVar15 = QSinglePointEvent::position((QSinglePointEvent *)mouseEvent);
    local_c0._8_8_ = QVar15.yp;
    local_c0._0_8_ = QVar15.xp;
    hoverRegion.d = (QRegionData *)QPointF::toPoint((QPointF *)local_c0);
    SVar9 = QMdiSubWindowPrivate::getSubControl(this_00,(QPoint *)&hoverRegion);
    this_00->hoveredSubControl = SVar9;
    hoverRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&hoverRegion);
    QVar6.x2.m_i = local_c0._8_4_;
    QVar6.y2.m_i = local_c0._12_4_;
    QVar6.x1.m_i = local_c0._0_4_;
    QVar6.y1.m_i = local_c0._4_4_;
    QVar14.x2.m_i = local_c0._8_4_;
    QVar14.y2.m_i = local_c0._12_4_;
    QVar14.x1.m_i = local_c0._0_4_;
    QVar14.y1.m_i = local_c0._4_4_;
    SVar9 = this_00->hoveredSubControl;
    if (((SVar1 & ~SC_TitleBarLabel) != SC_None) &&
       (SVar9 = SVar1, QVar14 = QVar6, SVar1 != this_00->hoveredSubControl)) {
      pQVar12 = QWidget::style(&this->super_QWidget);
      local_c0 = (**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,5,&options,SVar1,this);
      QRegion::operator+=(&hoverRegion,(QRect *)local_c0);
      SVar9 = this_00->hoveredSubControl;
      QVar14 = (QRect)local_c0;
    }
    local_c0 = (undefined1  [16])QVar14;
    if (SVar9 != SVar1 && (SVar9 & ~SC_TitleBarLabel) != SC_None) {
      pQVar12 = QWidget::style(&this->super_QWidget);
      QVar14 = (QRect)(**(code **)(*(long *)pQVar12 + 0xd8))
                                (pQVar12,5,&options,this_00->hoveredSubControl,this);
      local_c0 = (undefined1  [16])QVar14;
      QRegion::operator+=(&hoverRegion,(QRect *)local_c0);
    }
    pQVar12 = QWidget::style(&this->super_QWidget);
    bVar7 = isMacStyle(pQVar12);
    if (bVar7) {
      cVar8 = QRegion::isEmpty();
      if (cVar8 == '\0') {
        pQVar5 = (this->super_QWidget).data;
        iVar2 = (pQVar5->crect).x2.m_i;
        iVar3 = (pQVar5->crect).x1.m_i;
        iVar10 = QMdiSubWindowPrivate::titleBarHeight(this_00,&options);
        QRegion::QRegion((QRegion *)local_c0,0,0,(iVar2 - iVar3) + 1,iVar10,Rectangle);
        QRegion::operator+=(&hoverRegion,(QRegion *)local_c0);
        QRegion::~QRegion((QRegion *)local_c0);
      }
    }
    cVar8 = QRegion::isEmpty();
    if (cVar8 == '\0') {
      QWidget::update(&this->super_QWidget,&hoverRegion);
    }
    QRegion::~QRegion(&hoverRegion);
    QStyleOptionTitleBar::~QStyleOptionTitleBar(&options);
  }
  if ((((byte)mouseEvent[0x44] & 1) == 0) && (this_00->isInInteractiveMode != true)) {
    QVar15 = QSinglePointEvent::position((QSinglePointEvent *)mouseEvent);
    options.super_QStyleOptionComplex.super_QStyleOption._8_8_ = QVar15.yp;
    options.super_QStyleOptionComplex.super_QStyleOption._0_8_ = QVar15.xp;
    QVar13 = QPointF::toPoint((QPointF *)&options);
    local_c0._0_8_ = QVar13;
    OVar11 = QMdiSubWindowPrivate::getOperation(this_00,(QPoint *)local_c0);
    this_00->currentOperation = OVar11;
    if (OVar11 < TopResize) {
      if (OVar11 == Move) {
        cVar8 = this_00->moveEnabled;
        goto joined_r0x0041c64b;
      }
    }
    else {
      cVar8 = this_00->resizeEnabled;
joined_r0x0041c64b:
      if (cVar8 == '\0') {
        this_00->currentOperation = None;
      }
    }
    QMdiSubWindowPrivate::updateCursor(this_00);
  }
  else if (this_00->currentOperation < TopResize) {
    if ((this_00->currentOperation == Move) && (this_00->moveEnabled == true)) goto LAB_0041c5b9;
  }
  else if (this_00->resizeEnabled != false) {
LAB_0041c5b9:
    this_01 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    QVar15 = QSinglePointEvent::globalPosition((QSinglePointEvent *)mouseEvent);
    options.super_QStyleOptionComplex.super_QStyleOption._8_8_ = QVar15.yp;
    options.super_QStyleOptionComplex.super_QStyleOption._0_8_ = QVar15.xp;
    hoverRegion.d = (QRegionData *)QPointF::toPoint((QPointF *)&options);
    QVar13 = QWidget::mapFromGlobal(this_01,(QPoint *)&hoverRegion);
    local_c0._0_8_ = QVar13;
    QMdiSubWindowPrivate::setNewGeometry(this_00,(QPoint *)local_c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
LAB_0041c67f:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::mouseMoveEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseMoveEvent(mouseEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    // No update needed if we're in a move/resize operation.
    if (!d->isMoveOperation() && !d->isResizeOperation()) {
        // Find previous and current hover region.
        const QStyleOptionTitleBar options = d->titleBarOptions();
        QStyle::SubControl oldHover = d->hoveredSubControl;
        d->hoveredSubControl = d->getSubControl(mouseEvent->position().toPoint());
        QRegion hoverRegion;
        if (isHoverControl(oldHover) && oldHover != d->hoveredSubControl)
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options, oldHover, this);
        if (isHoverControl(d->hoveredSubControl) && d->hoveredSubControl != oldHover) {
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options,
                    d->hoveredSubControl, this);
        }

        if (isMacStyle(style()) && !hoverRegion.isEmpty())
            hoverRegion += QRegion(0, 0, width(), d->titleBarHeight(options));

        if (!hoverRegion.isEmpty())
            update(hoverRegion);
    }

    if ((mouseEvent->buttons() & Qt::LeftButton) || d->isInInteractiveMode) {
        if ((d->isResizeOperation() && d->resizeEnabled) || (d->isMoveOperation() && d->moveEnabled)) {
            // As setNewGeometry moves the window, it invalidates the pos() value of any mouse move events that are
            // currently queued in the event loop. Map to parent using globalPos() instead.
            d->setNewGeometry(parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        }
        return;
    }

    // Do not resize/move if not allowed.
    d->currentOperation = d->getOperation(mouseEvent->position().toPoint());
    if ((d->isResizeOperation() && !d->resizeEnabled) || (d->isMoveOperation() && !d->moveEnabled))
        d->currentOperation = QMdiSubWindowPrivate::None;
    d->updateCursor();
}